

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char delim;
  char *pcVar1;
  pointer __s;
  int iVar2;
  void *pvVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  undefined8 result_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((((this->allow_extra_args_ == true) && (result->_M_string_length != 0)) &&
      (pcVar1 = (result->_M_dataplus)._M_p, *pcVar1 == '[')) &&
     (pcVar1[result->_M_string_length - 1] == ']')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (result);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,result
               ,1,0xffffffffffffffff);
    CLI::detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_40,(string *)&local_60,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_allocated_capacity != &local_50) {
      operator_delete((void *)local_60._M_allocated_capacity,local_50._M_allocated_capacity + 1);
    }
    iVar4 = 0;
    for (result_00 = local_40._M_allocated_capacity; result_00 != local_40._8_8_;
        result_00 = result_00 + 0x20) {
      if (((string *)result_00)->_M_string_length != 0) {
        iVar2 = _add_result(this,(string *)result_00,res);
        iVar4 = iVar4 + iVar2;
      }
    }
    this_00 = &local_40;
LAB_001b7e16:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
  }
  else {
    delim = (this->super_OptionBase<CLI::Option>).delimiter_;
    if ((delim != '\0') && (result->_M_string_length != 0)) {
      __s = (result->_M_dataplus)._M_p;
      pvVar3 = memchr(__s,(int)delim,result->_M_string_length);
      if ((long)pvVar3 - (long)__s != -1 && pvVar3 != (void *)0x0) {
        CLI::detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_60,result,delim);
        iVar4 = 0;
        for (; local_60._M_allocated_capacity != local_60._8_8_;
            local_60._M_allocated_capacity = local_60._M_allocated_capacity + 0x20) {
          if (*(long *)(local_60._M_allocated_capacity + 8) != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,(value_type *)local_60._M_allocated_capacity);
            iVar4 = iVar4 + 1;
          }
        }
        this_00 = &local_60;
        goto LAB_001b7e16;
      }
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,result);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

CLI11_INLINE int Option::_add_result(std::string &&result, std::vector<std::string> &res) const {
    int result_count = 0;
    if(allow_extra_args_ && !result.empty() && result.front() == '[' &&
       result.back() == ']') {  // this is now a vector string likely from the default or user entry
        result.pop_back();

        for(auto &var : CLI::detail::split(result.substr(1), ',')) {
            if(!var.empty()) {
                result_count += _add_result(std::move(var), res);
            }
        }
        return result_count;
    }
    if(delimiter_ == '\0') {
        res.push_back(std::move(result));
        ++result_count;
    } else {
        if((result.find_first_of(delimiter_) != std::string::npos)) {
            for(const auto &var : CLI::detail::split(result, delimiter_)) {
                if(!var.empty()) {
                    res.push_back(var);
                    ++result_count;
                }
            }
        } else {
            res.push_back(std::move(result));
            ++result_count;
        }
    }
    return result_count;
}